

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall mp::NLFeeder_Easy::FillObjNonzeros(NLFeeder_Easy *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  size_t *psVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  _Bvector_impl *p_Var5;
  ulong *puVar6;
  ulong uVar7;
  size_t sVar8;
  size_t pos_end;
  size_t sVar9;
  size_type sVar10;
  bool bVar11;
  double dVar12;
  reference rVar13;
  _Bit_iterator __first;
  _Bit_iterator __last;
  
  this_00 = &this->obj_grad_supp_;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,(long)(this->nlme_).vars_.num_col_,false)
  ;
  if ((this->nlme_).obj_c_ != (double *)0x0) {
    sVar10 = (size_type)(this->nlme_).vars_.num_col_;
    while (sVar10 = sVar10 - 1, sVar10 != 0xffffffffffffffff) {
      dVar12 = (this->nlme_).obj_c_[sVar10];
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar10);
      puVar6 = rVar13._M_p;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        uVar7 = rVar13._M_mask | *puVar6;
      }
      else {
        uVar7 = ~rVar13._M_mask & *puVar6;
      }
      *puVar6 = uVar7;
    }
  }
  sVar9 = (this->nlme_).Q_.num_nz_;
  if (sVar9 != 0) {
    psVar1 = (this->nlme_).Q_.start_;
    piVar2 = (this->nlme_).Q_.index_;
    sVar10 = (size_type)(this->nlme_).vars_.num_col_;
    while (bVar11 = sVar10 != 0, sVar10 = sVar10 - 1, bVar11) {
      for (sVar8 = psVar1[sVar10]; sVar9 != sVar8; sVar8 = sVar8 + 1) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar10);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)piVar2[sVar8]);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
      }
      sVar9 = psVar1[sVar10];
    }
  }
  p_Var5 = &(this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar3 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar4;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  dVar12 = std::accumulate<std::_Bit_iterator,double>(__first,__last,0.0);
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros =
       (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
  return;
}

Assistant:

void FillObjNonzeros() {
    obj_grad_supp_.resize(NLME().NumCols());
    // Linear part -- if provided
    if (NLME().ObjCoefficients()) {
      for (auto i=NLME().NumCols(); i--; )
        obj_grad_supp_[i] = (NLME().ObjCoefficients()[i]);
    }
    // QP part
    auto Q = NLME().Hessian();
    if (Q.num_nz_) {
      assert(Q.num_colrow_ == NLME().NumCols());
      auto pos_end = Q.num_nz_;
      for (auto i=NLME().NumCols(); i--; ) {
        for (auto pos=Q.start_[i]; pos!=pos_end; ++pos) {
          obj_grad_supp_[i] = true;             // x
          obj_grad_supp_[Q.index_[pos]] = true; // y
        }
        pos_end = Q.start_[i];
      }
    }
    header_.num_obj_nonzeros
        = std::accumulate(obj_grad_supp_.begin(),
                          obj_grad_supp_.end(), 0.0);
  }